

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O1

Wlc_Ntk_t *
Wlc_ReadSmtBuffer(char *pFileName,char *pBuffer,char *pLimit,int fOldParser,int fPrintTree)

{
  char cVar1;
  void *__ptr;
  bool bVar2;
  Smt_Prs_t *p;
  Abc_Nam_t *p_00;
  long lVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  Wlc_Ntk_t *pWVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  
  iVar10 = 0;
  iVar9 = 0;
  if (pBuffer < pLimit) {
    bVar12 = false;
    bVar2 = false;
    iVar9 = 0;
    iVar10 = 0;
    pcVar7 = pBuffer;
    do {
      cVar1 = *pcVar7;
      if (cVar1 == '|') {
        bVar2 = (bool)(bVar2 ^ 1);
      }
      else if (cVar1 == ')') {
        iVar9 = iVar9 + (uint)!bVar2;
      }
      else if (cVar1 == '(') {
        iVar10 = iVar10 + (uint)!bVar2;
      }
      else if ((cVar1 != ';') || (bVar2)) {
        if ((cVar1 == '\"') && ((pcVar7[-1] != '\\' && (!bVar2)))) {
          while( true ) {
            *pcVar7 = ' ';
            cVar1 = pcVar7[1];
            pcVar7 = pcVar7 + 1;
            if ((cVar1 == '\0') || ((cVar1 == '\"' && (!bVar12)))) break;
            bVar12 = cVar1 == '\\';
          }
          *pcVar7 = ' ';
          bVar2 = false;
        }
      }
      else {
        for (; (*pcVar7 != '\0' && (*pcVar7 != '\n')); pcVar7 = pcVar7 + 1) {
          *pcVar7 = ' ';
        }
      }
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 < pLimit);
  }
  if (iVar10 == iVar9) {
    if (iVar10 == 0) {
      puts("The input SMTLIB file has no opening or closing parentheses.");
    }
  }
  else {
    printf(
          "The input SMTLIB file has different number of opening and closing parentheses (%d and %d).\n"
          );
    iVar10 = 0;
  }
  if (iVar10 == 0) {
    p = (Smt_Prs_t *)0x0;
  }
  else {
    p = (Smt_Prs_t *)calloc(1,0x448);
    p->pName = pFileName;
    p->pBuffer = pBuffer;
    p->pLimit = pLimit;
    p->pCur = pBuffer;
    p_00 = Abc_NamStart(1000,0x18);
    p->pStrs = p_00;
    iVar9 = 1;
    do {
      lVar3 = 0x18;
      do {
        if (*(int *)(&UNK_00bb20d8 + lVar3) == iVar9) {
          pcVar7 = *(char **)((long)&s_Types[0].Type + lVar3);
          goto LAB_003724c5;
        }
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0xb8);
      pcVar7 = (char *)0x0;
LAB_003724c5:
      Abc_NamStrFindOrAdd(p_00,pcVar7,(int *)0x0);
      iVar9 = iVar9 + 1;
    } while (iVar9 != 0xb);
    iVar9 = Abc_NamObjNumMax(p_00);
    if (iVar9 != 0xb) {
      __assert_fail("Abc_NamObjNumMax(p) == SMT_PRS_END",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                    ,0x67,"void Smt_AddTypes(Abc_Nam_t *)");
    }
    if ((p->vStack).nCap < 100) {
      piVar4 = (p->vStack).pArray;
      if (piVar4 == (int *)0x0) {
        piVar4 = (int *)malloc(400);
      }
      else {
        piVar4 = (int *)realloc(piVar4,400);
      }
      (p->vStack).pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vStack).nCap = 100;
    }
    iVar9 = (p->vObjs).nCap;
    if (iVar9 <= iVar10) {
      iVar10 = iVar10 + 1;
      pVVar5 = (p->vObjs).pArray;
      if (pVVar5 == (Vec_Int_t *)0x0) {
        pVVar5 = (Vec_Int_t *)malloc((long)iVar10 << 4);
      }
      else {
        pVVar5 = (Vec_Int_t *)realloc(pVVar5,(long)iVar10 << 4);
      }
      (p->vObjs).pArray = pVVar5;
      memset(pVVar5 + iVar9,0,(long)(iVar10 - iVar9) << 4);
      (p->vObjs).nCap = iVar10;
    }
  }
  if (p == (Smt_Prs_t *)0x0) {
    return (Wlc_Ntk_t *)0x0;
  }
  Smt_PrsReadLines(p);
  if (fPrintTree != 0) {
    Smt_PrsPrintParser_rec(p,0,0);
  }
  cVar1 = p->ErrorStr[0];
  if (cVar1 != '\0') {
    pcVar7 = p->pBuffer;
    uVar8 = 0;
    if (pcVar7 < p->pCur) {
      uVar8 = 0;
      do {
        uVar8 = (ulong)((int)uVar8 + (uint)(*pcVar7 == '\n'));
        pcVar7 = pcVar7 + 1;
      } while (pcVar7 != p->pCur);
    }
    pWVar6 = (Wlc_Ntk_t *)0x0;
    printf("Line %d: %s\n",uVar8,p->ErrorStr);
    if (cVar1 != '\0') goto LAB_003725ff;
  }
  if (fOldParser == 0) {
    pWVar6 = Smt_PrsBuild2(p);
  }
  else {
    pWVar6 = Smt_PrsBuild(p);
  }
LAB_003725ff:
  if (p->pStrs != (Abc_Nam_t *)0x0) {
    Abc_NamDeref(p->pStrs);
  }
  piVar4 = (p->vStack).pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
    (p->vStack).pArray = (int *)0x0;
  }
  (p->vStack).nCap = 0;
  (p->vStack).nSize = 0;
  piVar4 = (p->vTempFans).pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
    (p->vTempFans).pArray = (int *)0x0;
  }
  (p->vTempFans).nCap = 0;
  (p->vTempFans).nSize = 0;
  if (0 < (p->vObjs).nCap) {
    lVar11 = 8;
    lVar3 = 0;
    do {
      __ptr = *(void **)((long)&((p->vObjs).pArray)->nCap + lVar11);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&((p->vObjs).pArray)->nCap + lVar11) = 0;
      }
      lVar3 = lVar3 + 1;
      lVar11 = lVar11 + 0x10;
    } while (lVar3 < (p->vObjs).nCap);
  }
  pVVar5 = (p->vObjs).pArray;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    free(pVVar5);
    (p->vObjs).pArray = (Vec_Int_t *)0x0;
  }
  (p->vObjs).nCap = 0;
  (p->vObjs).nSize = 0;
  free(p);
  return pWVar6;
}

Assistant:

Wlc_Ntk_t * Wlc_ReadSmtBuffer( char * pFileName, char * pBuffer, char * pLimit, int fOldParser, int fPrintTree )
{
    Wlc_Ntk_t * pNtk = NULL;
    int nCount = Smt_PrsRemoveComments( pBuffer, pLimit );
    Smt_Prs_t * p = Smt_PrsAlloc( pFileName, pBuffer, pLimit, nCount );
    if ( p == NULL )
        return NULL;
    Smt_PrsReadLines( p );
    if ( fPrintTree )
        Smt_PrsPrintParser( p );
    if ( Smt_PrsErrorPrint(p) )
        pNtk = fOldParser ? Smt_PrsBuild(p) : Smt_PrsBuild2(p);
    Smt_PrsFree( p );
    return pNtk;
}